

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.h
# Opt level: O0

void replay_record_orphaned(__cilkrts_worker *w)

{
  long in_RDI;
  
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0x498) == 1) {
    replay_record_orphaned_internal((__cilkrts_worker *)0x1191e5);
  }
  return;
}

Assistant:

COMMON_PORTABLE
inline void update_pedigree_on_leave_frame(__cilkrts_worker *w,
					   __cilkrts_stack_frame *sf) 
{
    // Update the worker's pedigree information if this is an ABI 1 or later
    // frame
    if (CILK_FRAME_VERSION_VALUE(sf->flags) >= 1)
    {
	w->pedigree.rank = sf->spawn_helper_pedigree.rank + 1;
	w->pedigree.parent = sf->spawn_helper_pedigree.parent;
    }
}